

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O0

char duckdb::AddOperatorOverflowCheck::Operation<signed_char,signed_char,signed_char>
               (char left,char right)

{
  bool bVar1;
  undefined8 uVar2;
  undefined1 in_SIL;
  undefined1 in_DIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *in_stack_00000008;
  OutOfRangeException *in_stack_00000010;
  PhysicalType in_stack_0000002f;
  char result;
  undefined7 in_stack_ffffffffffffff38;
  char in_stack_ffffffffffffff3f;
  int8_t in_stack_ffffffffffffff46;
  int8_t in_stack_ffffffffffffff47;
  allocator local_29;
  string local_28 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  undefined5 in_stack_fffffffffffffff8;
  char in_stack_fffffffffffffffd;
  
  bVar1 = TryAddOperator::Operation<signed_char,signed_char,signed_char>
                    (in_stack_ffffffffffffff47,in_stack_ffffffffffffff46,
                     (int8_t *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_28,"Overflow in addition of %s (%s + %s)!",&local_29);
    GetTypeId<signed_char>();
    TypeIdToString_abi_cxx11_(in_stack_0000002f);
    NumericHelper::ToString<signed_char>(in_stack_ffffffffffffff3f);
    NumericHelper::ToString<signed_char>(in_stack_ffffffffffffff3f);
    OutOfRangeException::
    OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_DIL,CONCAT16(in_SIL,CONCAT15(in_stack_fffffffffffffffd,
                                                        in_stack_fffffffffffffff8))),
               in_stack_fffffffffffffff0);
    __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  return in_stack_fffffffffffffffd;
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryAddOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of %s (%s + %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}